

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status
parse_query(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData,
           int parseSeparator)

{
  char cVar1;
  ulong uVar2;
  _func_int_void_ptr_char_ptr_size_t *callback;
  curi_status cVar3;
  int iVar4;
  char *pcVar5;
  curi_settings *settings_00;
  size_t sVar6;
  ulong uVar7;
  void *userData_00;
  
  uVar7 = *offset;
  settings_00 = settings;
  if (parseSeparator != 0) {
    settings_00 = (curi_settings *)"";
    if (uVar7 < len) {
      settings_00 = (curi_settings *)(uri + uVar7);
    }
    uVar7 = uVar7 + 1;
    *offset = uVar7;
    if (*(char *)&settings_00->allocate != '?') {
      return curi_status_error;
    }
  }
  if ((((settings->query_item_null_callback == (_func_int_void_ptr_char_ptr_size_t *)0x0) &&
       (settings->query_item_int_callback == (_func_int_void_ptr_char_ptr_size_t_long *)0x0)) &&
      (settings->query_item_double_callback == (_func_int_void_ptr_char_ptr_size_t_double *)0x0)) &&
     (userData_00 = userData,
     settings->query_item_str_callback == (_func_int_void_ptr_char_ptr_size_t_char_ptr_size_t *)0x0)
     ) {
    do {
      sVar6 = *offset;
      cVar3 = parse_query_fragment_char(uri,len,offset,settings_00,userData_00);
    } while (cVar3 == curi_status_success);
    *offset = sVar6;
  }
  else {
    cVar3 = parse_query_item(uri,len,offset,settings,userData);
    if (cVar3 != curi_status_success) {
      return cVar3;
    }
    cVar3 = curi_status_success;
    do {
      if (cVar3 != curi_status_success) {
        return cVar3;
      }
      uVar2 = *offset;
      cVar1 = settings->query_item_separator;
      pcVar5 = uri + uVar2;
      if (len <= uVar2) {
        pcVar5 = "";
      }
      *offset = uVar2 + 1;
    } while ((*pcVar5 == cVar1) &&
            (cVar3 = parse_query_item(uri,len,offset,settings,userData), cVar3 != curi_status_error)
            );
    *offset = uVar2;
  }
  sVar6 = *offset - uVar7;
  callback = settings->query_callback;
  if (settings->url_decode == 0) {
    cVar3 = curi_status_success;
    if (callback != (_func_int_void_ptr_char_ptr_size_t *)0x0 && *offset != uVar7) {
      iVar4 = (*callback)(userData,uri + uVar7,sVar6);
      cVar3 = (curi_status)(iVar4 == 0);
    }
    return cVar3;
  }
  cVar3 = handle_str_callback_url_decoded(callback,uri + uVar7,sVar6,settings,userData);
  return cVar3;
}

Assistant:

static curi_status parse_query(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData, int parseSeparator)
{
    // If not interested in individual items,
    //      query = "?" *query_fragment_char
    // if interested,
    //      query = "?" query_item *(query_item_separator query_item)
    //      query_item_separator = settings->query_item_separator (default is "&")

    curi_status status = curi_status_success;

    size_t queryStartOffset;

    if (parseSeparator && status == curi_status_success)
        status = parse_char('?', uri, len, offset, settings, userData);

    queryStartOffset = *offset;

    if (status == curi_status_success)
    {
        if (!settings->query_item_null_callback && !settings->query_item_int_callback && !settings->query_item_double_callback && !settings->query_item_str_callback)
        {
            while (status == curi_status_success)
            {
                size_t previousOffset = *offset;

                status = parse_query_fragment_char(uri, len, offset, settings, userData);

                if (status != curi_status_success)
                    *offset = previousOffset;
            }

            status = curi_status_success;
        }
        else
        {
            status = parse_query_item(uri, len, offset, settings, userData);

            if (status == curi_status_success)
            {
                curi_status tryStatus = curi_status_success;
                while (tryStatus == curi_status_success)
                {
                    size_t previousOffset = *offset;

                    tryStatus = parse_char(settings->query_item_separator, uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_success)
                        tryStatus = parse_query_item(uri, len, offset, settings, userData);

                    if (tryStatus == curi_status_error)
                        *offset = previousOffset;
                    else
                        status = tryStatus;
                }
            }
        }
    }

    if (status == curi_status_success)
        status = handle_query(uri + queryStartOffset, *offset - queryStartOffset, settings, userData);

    return status;
}